

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int deleteCell(Rtree *pRtree,RtreeNode *pNode,int iCell,int iHeight)

{
  u8 *puVar1;
  sqlite3_stmt *pStmt;
  RtreeNode **ppRVar2;
  int iVar3;
  int iVar4;
  Mem *pMem;
  i64 iNode;
  RtreeNode *pRVar5;
  ushort uVar6;
  ulong uVar7;
  long iValue;
  RtreeNode *ppNode;
  
  iValue = pNode->iNode;
  iVar3 = 0;
  if ((iValue != 1) && (ppNode = pNode, iVar3 = 0, pNode->pParent == (RtreeNode *)0x0)) {
    do {
      sqlite3_bind_int64(pRtree->pReadParent,1,iValue);
      iVar4 = sqlite3_step(pRtree->pReadParent);
      iVar3 = 0;
      if (iVar4 == 100) {
        pStmt = pRtree->pReadParent;
        pMem = columnMem(pStmt,0);
        iNode = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt);
        pRVar5 = pNode;
        if (pNode != (RtreeNode *)0x0) {
          do {
            if (pRVar5->iNode == iNode) {
              iVar3 = 0;
              goto LAB_001fcbd3;
            }
            ppRVar2 = &pRVar5->pParent;
            pRVar5 = *ppRVar2;
          } while (*ppRVar2 != (RtreeNode *)0x0);
        }
        iVar3 = nodeAcquire(pRtree,iNode,(RtreeNode *)0x0,&ppNode->pParent);
      }
LAB_001fcbd3:
      iVar4 = sqlite3_reset(pRtree->pReadParent);
      if (iVar4 != 0) {
        iVar3 = iVar4;
      }
      if ((iVar3 == 0) && (iVar3 = 0, ppNode->pParent == (RtreeNode *)0x0)) {
        iVar3 = 0x10b;
      }
      if (iVar3 != 0) break;
      ppNode = ppNode->pParent;
      iValue = ppNode->iNode;
      if ((iValue == 1) || (ppNode->pParent != (RtreeNode *)0x0)) break;
    } while( true );
  }
  if (iVar3 == 0) {
    puVar1 = pNode->zData;
    uVar7 = (ulong)pRtree->nBytesPerCell;
    memmove(puVar1 + uVar7 * (long)iCell + 4,puVar1 + uVar7 + uVar7 * (long)iCell + 4,
            (long)(int)(~iCell + (uint)(ushort)(*(ushort *)(puVar1 + 2) << 8 |
                                               *(ushort *)(puVar1 + 2) >> 8)) * uVar7);
    puVar1 = pNode->zData;
    uVar6 = ((ushort)puVar1[2] * 0x100 + (ushort)puVar1[3]) - 1;
    *(ushort *)(puVar1 + 2) = uVar6 * 0x100 | uVar6 >> 8;
    pNode->isDirty = 1;
    if (pNode->pParent != (RtreeNode *)0x0) {
      if (((pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell) / 3 <=
          (int)(uint)(ushort)(*(ushort *)(pNode->zData + 2) << 8 |
                             *(ushort *)(pNode->zData + 2) >> 8)) {
        iVar3 = fixBoundingBox(pRtree,pNode);
        return iVar3;
      }
      iVar3 = removeNode(pRtree,pNode,iHeight);
      return iVar3;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int deleteCell(Rtree *pRtree, RtreeNode *pNode, int iCell, int iHeight){
  RtreeNode *pParent;
  int rc;

  if( SQLITE_OK!=(rc = fixLeafParent(pRtree, pNode)) ){
    return rc;
  }

  /* Remove the cell from the node. This call just moves bytes around
  ** the in-memory node image, so it cannot fail.
  */
  nodeDeleteCell(pRtree, pNode, iCell);

  /* If the node is not the tree root and now has less than the minimum
  ** number of cells, remove it from the tree. Otherwise, update the
  ** cell in the parent node so that it tightly contains the updated
  ** node.
  */
  pParent = pNode->pParent;
  assert( pParent || pNode->iNode==1 );
  if( pParent ){
    if( NCELL(pNode)<RTREE_MINCELLS(pRtree) ){
      rc = removeNode(pRtree, pNode, iHeight);
    }else{
      rc = fixBoundingBox(pRtree, pNode);
    }
  }

  return rc;
}